

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.h
# Opt level: O1

void __thiscall ast::Statement_empty::~Statement_empty(Statement_empty *this)

{
  pointer pcVar1;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__Statement_0013bf38;
  pcVar1 = (this->super_Statement).label._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Statement).label.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

Statement_empty(string *l, Location left):
		Statement {left} {
		section_index = Sections::current_section->number;
		section_offset = Sections::current_section->content_size;
		add_label(l);
	 }